

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkSIprefix(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char p;
  int iVar4;
  ulong uVar5;
  precise_unit pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  undefined1 *local_c0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  uVar5 = unit_string->_M_string_length;
  if (2 < uVar5) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    cVar1 = pcVar2[1];
    bVar3 = true;
    if (cVar1 == 'A') goto LAB_0018904f;
    local_c0 = (undefined1 *)getPrefixMultiplier2Char(*pcVar2,cVar1);
    if (((double)local_c0 == 0.0) && (!NAN((double)local_c0))) goto LAB_0018904d;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)unit_string);
    if (local_a8 != 1) {
LAB_00188fae:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_b0,(char *)((long)local_b0 + local_a8));
      pVar6 = unit_quick_match(&local_50,match_flags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if ((pVar6._8_8_ & 0xffffffff) == 0xfa94a488 && NAN(pVar6.multiplier_)) {
        uVar5 = unit_string->_M_string_length;
        goto LAB_00189043;
      }
      goto LAB_001893e1;
    }
    cVar1 = (char)*local_b0;
    if (cVar1 == 'k') goto LAB_001893f0;
    if (cVar1 != 'b') {
      if (cVar1 != 'B') goto LAB_00188fae;
      goto LAB_00189206;
    }
    goto LAB_0018921a;
  }
LAB_00189043:
  if (uVar5 < 2) goto LAB_001893b3;
LAB_0018904d:
  bVar3 = false;
LAB_0018904f:
  cVar1 = *(unit_string->_M_dataplus)._M_p;
  p = 'n';
  if (cVar1 != 'N') {
    p = cVar1;
  }
  if (((uint)match_flags >> 9 & 1) == 0) {
    p = cVar1;
  }
  if (((uint)match_flags >> 8 & 1) == 0) {
    local_c0 = (undefined1 *)getPrefixMultiplier(p);
    if (((double)local_c0 != 0.0) || (NAN((double)local_c0))) goto LAB_001891c5;
    goto switchD_001890af_caseD_46;
  }
  switch(p) {
  case 'E':
    local_c0 = (undefined1 *)0x43abc16d674ec800;
    break;
  case 'F':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'N':
  case 'O':
  case 'S':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'b':
  case 'e':
  case 'g':
  case 'i':
  case 'j':
  case 'l':
  case 'o':
  case 's':
  case 't':
  case 'v':
  case 'w':
  case 'x':
    goto switchD_001890af_caseD_46;
  case 'G':
    local_c0 = (undefined1 *)0x41cdcd6500000000;
    break;
  case 'M':
    local_c0 = (undefined1 *)0x412e848000000000;
    break;
  case 'P':
    local_c0 = (undefined1 *)0x430c6bf526340000;
    break;
  case 'Q':
    local_c0 = (undefined1 *)0x46293e5939a08cea;
    break;
  case 'R':
    local_c0 = (undefined1 *)0x4589d971e4fe8402;
    break;
  case 'T':
    local_c0 = (undefined1 *)0x426d1a94a2000000;
    break;
  case 'Y':
    local_c0 = (undefined1 *)0x44ea784379d99db4;
    break;
  case 'Z':
    local_c0 = (undefined1 *)0x444b1ae4d6e2ef50;
    break;
  case 'a':
    local_c0 = (undefined1 *)0x3c32725dd1d243ac;
    break;
  case 'c':
    local_c0 = &DAT_3f847ae147ae147b;
    break;
  case 'd':
    local_c0 = (undefined1 *)0x3fb999999999999a;
    break;
  case 'f':
    local_c0 = (undefined1 *)0x3cd203af9ee75616;
    break;
  case 'h':
    local_c0 = (undefined1 *)0x4059000000000000;
    break;
  case 'k':
    local_c0 = (undefined1 *)0x408f400000000000;
    break;
  case 'm':
    local_c0 = (undefined1 *)0x3f50624dd2f1a9fc;
    break;
  case 'n':
    local_c0 = (undefined1 *)0x3e112e0be826d695;
    break;
  case 'p':
    local_c0 = (undefined1 *)0x3d719799812dea11;
    break;
  case 'q':
    local_c0 = (undefined1 *)0x39b4484bfeebc2a0;
    break;
  case 'r':
    local_c0 = (undefined1 *)0x3a53ce9a36f23c10;
    break;
  case 'u':
switchD_001890af_caseD_75:
    local_c0 = (undefined1 *)0x3eb0c6f7a0b5ed8d;
    break;
  case 'y':
    local_c0 = (undefined1 *)0x3af357c299a88ea7;
    break;
  case 'z':
    local_c0 = (undefined1 *)0x3b92e3b40a0e9b4f;
    break;
  default:
    if (p == -0x4b) goto switchD_001890af_caseD_75;
    goto switchD_001890af_caseD_46;
  }
LAB_001891c5:
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)unit_string);
  if (local_a8 == 1) {
    cVar1 = (char)*local_b0;
    if (cVar1 == 'k') {
LAB_001893f0:
      local_c0 = (undefined1 *)0x7ff4000000000000;
      uVar5 = 0xfa94a488;
    }
    else {
      if (cVar1 != 'b') {
        if (cVar1 != 'B') goto LAB_00189224;
LAB_00189206:
        local_c0 = (undefined1 *)((double)local_c0 * 8.0);
      }
LAB_0018921a:
      uVar5 = 0x4000000;
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    goto LAB_00189457;
  }
LAB_00189224:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_b0,(char *)((long)local_b0 + local_a8));
  pVar6 = unit_quick_match(&local_70,match_flags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((pVar6._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar6.multiplier_)) {
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
LAB_001893e1:
    uVar5 = pVar6._8_8_;
    local_c0 = (undefined1 *)((double)local_c0 * pVar6.multiplier_);
    goto LAB_00189457;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
switchD_001890af_caseD_46:
  if (bVar3) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    local_c0 = (undefined1 *)getPrefixMultiplier2Char(*pcVar2,pcVar2[1]);
    if (((double)local_c0 != 0.0) || (NAN((double)local_c0))) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)unit_string);
      iVar4 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar4 == 0) {
        local_c0 = (undefined1 *)((double)local_c0 * 8.0);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar4 != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_b0,(char *)((long)local_b0 + local_a8));
          pVar6 = unit_quick_match(&local_90,match_flags);
          uVar5 = pVar6._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if ((uVar5 & 0xffffffff) != 0xfa94a488 || !NAN(pVar6.multiplier_)) {
            local_c0 = (undefined1 *)((double)local_c0 * pVar6.multiplier_);
            goto LAB_00189457;
          }
          goto LAB_001893b3;
        }
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      uVar5 = 0x4000000;
      goto LAB_00189457;
    }
  }
LAB_001893b3:
  local_c0 = (undefined1 *)0x7ff4000000000000;
  uVar5 = 0xfa94a488;
LAB_00189457:
  pVar6.base_units_ = (unit_data)(int)uVar5;
  pVar6.commodity_ = (int)(uVar5 >> 0x20);
  pVar6.multiplier_ = (double)local_c0;
  return pVar6;
}

Assistant:

static precise_unit
    checkSIprefix(const std::string& unit_string, std::uint64_t match_flags)
{
    bool threeAgain{false};
    if (unit_string.size() >= 3) {
        if (unit_string[1] == 'A') {
            threeAgain = true;
        } else {
            auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
            if (mux != 0.0) {
                auto ustring = unit_string.substr(2);
                if (ustring.size() == 1) {
                    switch (ustring.front()) {
                        case 'B':
                            return {mux, precise::data::byte};
                        case 'b':
                            return {mux, precise::data::bit};
                        case 'k':
                            return precise::invalid;
                        default:
                            break;
                    }
                }

                auto retunit = unit_quick_match(ustring, match_flags);
                if (is_valid(retunit)) {
                    return {mux, retunit};
                }
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto c = unit_string.front();
        if (c == 'N' && ((match_flags & case_insensitive) != 0)) {
            c = 'n';
        }
        auto mux = ((match_flags & strict_si) == 0) ?
            getPrefixMultiplier(c) :
            getStrictSIPrefixMultiplier(c);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(1);
            if (ustring.size() == 1) {
                switch (ustring.front()) {
                    case 'B':
                        return {mux, precise::data::byte};
                    case 'b':
                        return {mux, precise::data::bit};
                    case 'k':
                        return precise::invalid;
                    default:
                        break;
                }
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return {mux, retunit};
            }
        }
    }
    if (threeAgain) {
        auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(2);
            if (ustring == "B") {
                return {mux, precise::data::byte};
            }
            if (ustring == "b") {
                return {mux, precise::data::bit};
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (is_valid(retunit)) {
                return {mux, retunit};
            }
        }
    }
    return precise::invalid;
}